

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib575.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  char *pcVar9;
  timeval tVar10;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1d8;
  int local_1d4;
  undefined8 local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1d8 = 0;
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                  ,0x30,iVar2,uVar4);
  }
  if (iVar2 != 0) goto LAB_00102420;
  lVar5 = curl_easy_init();
  iVar2 = 0;
  if (lVar5 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                  ,0x32);
    iVar2 = 0x7c;
  }
  if (lVar5 == 0) {
LAB_00102408:
    lVar7 = 0;
    lVar6 = lVar5;
  }
  else {
    iVar3 = curl_easy_setopt(lVar5,0x2712,URL);
    uVar1 = _stderr;
    iVar2 = 0;
    if (iVar3 != 0) {
      uVar4 = curl_easy_strerror(iVar3);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                    ,0x34,iVar3,uVar4);
      iVar2 = iVar3;
    }
    if (iVar2 != 0) goto LAB_00102408;
    iVar3 = curl_easy_setopt(lVar5,0xc5,1);
    uVar1 = _stderr;
    iVar2 = 0;
    if (iVar3 != 0) {
      uVar4 = curl_easy_strerror(iVar3);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                    ,0x35,iVar3,uVar4);
      iVar2 = iVar3;
    }
    if (iVar2 != 0) goto LAB_00102408;
    iVar3 = curl_easy_setopt(lVar5,0x29,1);
    uVar1 = _stderr;
    iVar2 = 0;
    if (iVar3 != 0) {
      uVar4 = curl_easy_strerror(iVar3);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                    ,0x36,iVar3,uVar4);
      iVar2 = iVar3;
    }
    if (iVar2 != 0) goto LAB_00102408;
    iVar2 = curl_easy_perform(lVar5);
    if (iVar2 != 0) goto LAB_00102408;
    iVar2 = curl_easy_perform(lVar5);
    if (iVar2 != 0) goto LAB_00102408;
    lVar6 = curl_easy_duphandle(lVar5);
    if (lVar6 == 0) {
      iVar2 = 0;
      goto LAB_00102408;
    }
    curl_easy_cleanup(lVar5);
    lVar7 = curl_multi_init();
    if (lVar7 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                    ,0x46);
      iVar2 = 0x7b;
    }
    else {
      iVar2 = curl_multi_add_handle(lVar7,lVar6);
      uVar1 = _stderr;
      if (iVar2 == 0) {
        iVar2 = 0;
      }
      else {
        uVar4 = curl_multi_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                      ,0x48,iVar2,uVar4);
      }
      if (iVar2 == 0) {
        iVar2 = curl_multi_perform(lVar7,&local_1d8);
        uVar1 = _stderr;
        if (iVar2 == 0) {
          iVar2 = 0;
          if (local_1d8 < 0) {
            curl_mfprintf(_stderr,
                          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                          ,0x4a);
            iVar2 = 0x7a;
          }
        }
        else {
          uVar4 = curl_multi_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                        ,0x4a,iVar2,uVar4);
        }
        if (iVar2 == 0) {
          tVar10 = tutil_tvnow();
          lVar5 = tutil_tvdiff(tVar10,tv_test_start);
          iVar2 = 0;
          if (lVar5 < 0xea61) {
            if (local_1d8 != 0) {
              iVar2 = 0;
              do {
                local_1d4 = -99;
                local_1c8.tv_sec = 0;
                local_1c8.tv_usec = 100000;
                local_b8.__fds_bits[0] = 0;
                local_b8.__fds_bits[1] = 0;
                local_b8.__fds_bits[2] = 0;
                local_b8.__fds_bits[3] = 0;
                local_b8.__fds_bits[4] = 0;
                local_b8.__fds_bits[5] = 0;
                local_b8.__fds_bits[6] = 0;
                local_b8.__fds_bits[7] = 0;
                local_b8.__fds_bits[8] = 0;
                local_b8.__fds_bits[9] = 0;
                local_b8.__fds_bits[10] = 0;
                local_b8.__fds_bits[0xb] = 0;
                local_b8.__fds_bits[0xc] = 0;
                local_b8.__fds_bits[0xd] = 0;
                local_b8.__fds_bits[0xe] = 0;
                local_b8.__fds_bits[0xf] = 0;
                local_138.__fds_bits[0] = 0;
                local_138.__fds_bits[1] = 0;
                local_138.__fds_bits[2] = 0;
                local_138.__fds_bits[3] = 0;
                local_138.__fds_bits[4] = 0;
                local_138.__fds_bits[5] = 0;
                local_138.__fds_bits[6] = 0;
                local_138.__fds_bits[7] = 0;
                local_138.__fds_bits[8] = 0;
                local_138.__fds_bits[9] = 0;
                local_138.__fds_bits[10] = 0;
                local_138.__fds_bits[0xb] = 0;
                local_138.__fds_bits[0xc] = 0;
                local_138.__fds_bits[0xd] = 0;
                local_138.__fds_bits[0xe] = 0;
                local_138.__fds_bits[0xf] = 0;
                local_1b8.__fds_bits[0xe] = 0;
                local_1b8.__fds_bits[0xf] = 0;
                local_1b8.__fds_bits[0xc] = 0;
                local_1b8.__fds_bits[0xd] = 0;
                local_1b8.__fds_bits[10] = 0;
                local_1b8.__fds_bits[0xb] = 0;
                local_1b8.__fds_bits[8] = 0;
                local_1b8.__fds_bits[9] = 0;
                local_1b8.__fds_bits[6] = 0;
                local_1b8.__fds_bits[7] = 0;
                local_1b8.__fds_bits[4] = 0;
                local_1b8.__fds_bits[5] = 0;
                local_1b8.__fds_bits[2] = 0;
                local_1b8.__fds_bits[3] = 0;
                local_1b8.__fds_bits[0] = 0;
                local_1b8.__fds_bits[1] = 0;
                iVar3 = curl_multi_fdset(lVar7,&local_b8,&local_138,&local_1b8,&local_1d4);
                uVar1 = _stderr;
                if (iVar3 == 0) {
                  if (local_1d4 < -1) {
                    curl_mfprintf(_stderr,
                                  "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                                  ,0x5c);
                    iVar2 = 0x7a;
                  }
                }
                else {
                  uVar4 = curl_multi_strerror(iVar3);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                                ,0x5c,iVar3,uVar4);
                  iVar2 = iVar3;
                }
                iVar3 = 0xc;
                if (iVar2 == 0) {
                  iVar2 = select_wrapper(local_1d4 + 1,&local_b8,&local_138,&local_1b8,&local_1c8);
                  if (iVar2 == -1) {
                    piVar8 = __errno_location();
                    iVar2 = *piVar8;
                    local_1d0 = _stderr;
                    pcVar9 = strerror(iVar2);
                    curl_mfprintf(local_1d0,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                                  ,0x60,iVar2,pcVar9);
                    iVar2 = 0x79;
                  }
                  else {
                    tVar10 = tutil_tvnow();
                    lVar5 = tutil_tvdiff(tVar10,tv_test_start);
                    if (lVar5 < 0xea61) {
                      iVar2 = curl_multi_perform(lVar7,&local_1d8);
                      uVar1 = _stderr;
                      if (iVar2 == 0) {
                        iVar2 = 0;
                        if (local_1d8 < 0) {
                          curl_mfprintf(_stderr,
                                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                                        ,100);
                          iVar2 = 0x7a;
                        }
                      }
                      else {
                        uVar4 = curl_multi_strerror(iVar2);
                        curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                                      ,100,iVar2,uVar4);
                      }
                      if (iVar2 == 0) {
                        tVar10 = tutil_tvnow();
                        lVar5 = tutil_tvdiff(tVar10,tv_test_start);
                        iVar3 = 0;
                        iVar2 = 0;
                        if (60000 < lVar5) {
                          curl_mfprintf(_stderr,
                                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                                        ,0x66);
                          iVar2 = 0x7d;
                          iVar3 = 0xc;
                        }
                      }
                    }
                    else {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                                    ,0x62);
                      iVar2 = 0x7d;
                    }
                  }
                }
                if (iVar3 != 0) {
                  if (iVar3 != 0xc) goto LAB_00102420;
                  break;
                }
              } while (local_1d8 != 0);
            }
          }
          else {
            curl_mfprintf(_stderr,
                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                          ,0x4c);
            iVar2 = 0x7d;
          }
        }
      }
    }
  }
  curl_multi_cleanup(lVar7);
  curl_easy_cleanup(lVar6);
  curl_global_cleanup();
LAB_00102420:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURL *handle = NULL;
  CURL *duphandle = NULL;
  CURLM *mhandle = NULL;
  int res = 0;
  int still_running = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(handle);

  easy_setopt(handle, CURLOPT_URL, URL);
  easy_setopt(handle, CURLOPT_WILDCARDMATCH, 1L);
  easy_setopt(handle, CURLOPT_VERBOSE, 1L);

  res = curl_easy_perform(handle);
  if(res)
    goto test_cleanup;

  res = curl_easy_perform(handle);
  if(res)
    goto test_cleanup;

  duphandle = curl_easy_duphandle(handle);
  if(!duphandle)
    goto test_cleanup;
  curl_easy_cleanup(handle);
  handle = duphandle;

  multi_init(mhandle);

  multi_add_handle(mhandle, handle);

  multi_perform(mhandle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(mhandle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    multi_perform(mhandle, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(mhandle);
  curl_easy_cleanup(handle);
  curl_global_cleanup();

  return res;
}